

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TapeUEF.cpp
# Opt level: O1

void __thiscall Storage::Tape::UEF::queue_carrier_tone_with_dummy(UEF *this)

{
  ushort uVar1;
  undefined8 in_RAX;
  uint uVar2;
  uint uVar3;
  uint8_t bytes [2];
  uint8_t bytes_1 [2];
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  gzread(this->file_,(long)&uStack_28 + 4,2);
  uVar1 = uStack_28._4_2_;
  uVar3 = (uint)uStack_28._4_2_;
  gzread(this->file_,(long)&uStack_28 + 6,2);
  uVar2 = (uint)uStack_28._6_2_;
  if (uVar1 != 0) {
    do {
      queue_bit(this,1);
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  queue_implicit_byte(this,0xaa);
  if (uStack_28._6_2_ != 0) {
    do {
      queue_bit(this,1);
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
  }
  return;
}

Assistant:

void UEF::queue_carrier_tone_with_dummy() {
	unsigned int pre_cycles = unsigned(gzget16(file_));
	unsigned int post_cycles = unsigned(gzget16(file_));
	while(pre_cycles--) queue_bit(1);
	queue_implicit_byte(0xaa);
	while(post_cycles--) queue_bit(1);
}